

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O1

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::
Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
::Iterator<Kernel::TypedTermList>
          (Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
           *this,SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs> *parent,Node *root,
          TypedTermList query,bool retrieveSubstitution,bool reversed)

{
  Kernel::RobSubstitution::RobSubstitution((RobSubstitution *)this);
  (this->_leafData).
  super_OptionBase<Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Rhs_*>_>._isSome =
       false;
  (this->_normalizationBacktrackData)._boList = (BacktrackObject *)0x0;
  (this->_svStack)._capacity = 0;
  (this->_svStack)._stack = (uint *)0x0;
  (this->_svStack)._cursor = (uint *)0x0;
  (this->_svStack)._end = (uint *)0x0;
  (this->_nodeIterators)._capacity = 0;
  (this->_nodeIterators)._stack =
       (VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>
        *)0x0;
  (this->_nodeIterators)._cursor =
       (VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>
        *)0x0;
  (this->_nodeIterators)._end =
       (VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>
        *)0x0;
  (this->_queryInitBacktrackData)._boList = (BacktrackObject *)0x0;
  (this->_bdStack)._capacity = 0;
  (this->_bdStack)._stack = (BacktrackData *)0x0;
  (this->_bdStack)._cursor = (BacktrackData *)0x0;
  (this->_bdStack)._end = (BacktrackData *)0x0;
  init<Kernel::TypedTermList>(this,parent,root,query,retrieveSubstitution,reversed);
  return;
}

Assistant:

Iterator(SubstitutionTree* parent, Node* root, TermOrLit query, bool retrieveSubstitution, bool reversed, AlgoArgs... args)
       : _algo()
      { init(parent, root, query, retrieveSubstitution, reversed, std::move(args)...); }